

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O3

void __thiscall cornerstone::buffer::put(buffer *this,string *str)

{
  uint uVar1;
  uint uVar2;
  overflow_error *this_00;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_type sVar6;
  ulong uVar7;
  
  uVar1 = *(uint *)this;
  uVar2 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar2 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar3 = (ulong)*(uint *)(this + 4);
    sVar6 = str->_M_string_length;
    if ((uVar2 & uVar1) - uVar3 < sVar6 + 1) goto LAB_00140a99;
    lVar5 = 8;
  }
  else {
    uVar3 = (ulong)(uVar1 >> 0x10);
    sVar6 = str->_M_string_length;
    if ((uVar2 & uVar1) - uVar3 < sVar6 + 1) {
LAB_00140a99:
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this_00,"insufficient buffer to store a string");
      __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    lVar5 = 4;
  }
  if (sVar6 == 0) {
    uVar7 = 0;
  }
  else {
    uVar4 = 0;
    do {
      this[uVar4 + uVar3 + lVar5] = *(buffer *)((str->_M_dataplus)._M_p + uVar4);
      uVar4 = uVar4 + 1;
      uVar7 = str->_M_string_length;
    } while (uVar4 < uVar7);
  }
  this[uVar7 + uVar3 + lVar5] = (buffer)0x0;
  if (*(int *)this < 0) {
    *(int *)(this + 4) = (int)str->_M_string_length + *(int *)(this + 4) + 1;
  }
  else {
    *(short *)(this + 2) = (short)((uint)*(int *)this >> 0x10) + (short)str->_M_string_length + 1;
  }
  return;
}

Assistant:

size_t buffer::size() const
{
    return (size_t)(__size_of_block(this));
}